

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicLattice.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::CubicLattice::getLatticeConstant(CubicLattice *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  value_type_conflict2 *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *lc;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3019ce);
  this_00 = (vector<double,_std::allocator<double>_> *)
            Vector3<double>::x((Vector3<double> *)(in_RSI + 0xb));
  std::vector<double,_std::allocator<double>_>::push_back(this_00,in_RSI);
  return in_RDI;
}

Assistant:

std::vector<RealType> CubicLattice::getLatticeConstant() {
    std::vector<RealType> lc;

    lc.push_back(cellLen.x());
    return lc;
  }